

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

optional<LockPoints> *
CalculateLockPointsAtTip
          (optional<LockPoints> *__return_storage_ptr__,CBlockIndex *tip,CCoinsView *coins_view,
          CTransaction *tx)

{
  int iVar1;
  pointer pCVar2;
  CBlockIndex *pCVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uVar7;
  CBlockIndex **ppCVar8;
  int iVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  pair<int,_long> pVar11;
  ulong local_140;
  vector<int,_std::allocator<int>_> prev_heights;
  _Storage<std::vector<int,_std::allocator<int>_>,_false> local_118;
  char local_100;
  CBlockIndex next_tip;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (tip == (CBlockIndex *)0x0) {
    __assert_fail("tip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc9,
                  "std::optional<LockPoints> CalculateLockPointsAtTip(CBlockIndex *, const CCoinsView &, const CTransaction &)"
                 );
  }
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            (&prev_heights,
             ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68);
  uVar10 = 0;
  while( true ) {
    pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68;
    local_140 = uVar10;
    if (uVar6 <= uVar10) break;
    Coin::Coin((Coin *)&next_tip);
    iVar4 = (**coins_view->_vptr_CCoinsView)(coins_view,pCVar2 + uVar10,&next_tip);
    if ((char)iVar4 == '\0') {
      base_blob<256u>::GetHex_abi_cxx11_(&local_58,(base_blob<256u> *)&tx->hash);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "CalculatePrevHeights";
      logging_function._M_len = 0x14;
      LogPrintFormatInternal<char[21],unsigned_long,std::__cxx11::string>
                (logging_function,source_file,0xb6,ALL,Info,(ConstevalFormatString<3U>)0xcd4927,
                 (char (*) [21])"CalculatePrevHeights",&local_140,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      uVar5 = next_tip.nChainWork.super_base_uint<256U>.pn[0] >> 1;
      if (uVar5 == 0x7fffffff) {
        uVar5 = tip->nHeight + 1;
      }
      prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_140] = uVar5;
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&next_tip.pprev);
    if ((char)iVar4 == '\0') {
      local_100 = '\0';
      goto LAB_008aad16;
    }
    uVar10 = local_140 + 1;
  }
  local_118._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_118._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_118._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prev_heights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_100 = '\x01';
LAB_008aad16:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&prev_heights.super__Vector_base<int,_std::allocator<int>_>);
  if (uVar10 < uVar6) {
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_engaged = false;
  }
  else {
    CBlockIndex::CBlockIndex(&next_tip);
    next_tip.nHeight = tip->nHeight + 1;
    next_tip.pprev = tip;
    if (local_100 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_008aaf1d;
    }
    pVar11 = CalculateSequenceLocks(tx,1,&local_118._M_value,&next_tip);
    if (local_100 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
      goto LAB_008aaf1d;
    }
    iVar4 = 0;
    for (uVar7 = local_118._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (pointer)uVar7 !=
        local_118._M_value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish; uVar7 = uVar7 + 4) {
      iVar1 = *(int *)uVar7;
      iVar9 = iVar1;
      if (iVar1 < iVar4) {
        iVar9 = iVar4;
      }
      if (iVar1 != next_tip.nHeight) {
        iVar4 = iVar9;
      }
    }
    local_58._M_dataplus._M_p = (pointer)CBlockIndex::GetAncestor(tip,iVar4);
    ppCVar8 = inline_assertion_check<true,CBlockIndex*>
                        ((CBlockIndex **)&local_58,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                         ,0xee,"CalculateLockPointsAtTip","tip->GetAncestor(max_input_height)");
    pCVar3 = *ppCVar8;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.height = pVar11.first;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.time = pVar11.second;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_payload._M_value.maxInputBlock = pCVar3;
    (__return_storage_ptr__->super__Optional_base<LockPoints,_true,_true>)._M_payload.
    super__Optional_payload_base<LockPoints>._M_engaged = true;
  }
  std::_Optional_payload_base<std::vector<int,_std::allocator<int>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<int,_std::allocator<int>_>_> *)&local_118._M_value)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_008aaf1d:
  __stack_chk_fail();
}

Assistant:

std::optional<LockPoints> CalculateLockPointsAtTip(
    CBlockIndex* tip,
    const CCoinsView& coins_view,
    const CTransaction& tx)
{
    assert(tip);

    auto prev_heights{CalculatePrevHeights(*tip, coins_view, tx)};
    if (!prev_heights.has_value()) return std::nullopt;

    CBlockIndex next_tip;
    next_tip.pprev = tip;
    // When SequenceLocks() is called within ConnectBlock(), the height
    // of the block *being* evaluated is what is used.
    // Thus if we want to know if a transaction can be part of the
    // *next* block, we need to use one more than active_chainstate.m_chain.Height()
    next_tip.nHeight = tip->nHeight + 1;
    const auto [min_height, min_time] = CalculateSequenceLocks(tx, STANDARD_LOCKTIME_VERIFY_FLAGS, prev_heights.value(), next_tip);

    // Also store the hash of the block with the highest height of
    // all the blocks which have sequence locked prevouts.
    // This hash needs to still be on the chain
    // for these LockPoint calculations to be valid
    // Note: It is impossible to correctly calculate a maxInputBlock
    // if any of the sequence locked inputs depend on unconfirmed txs,
    // except in the special case where the relative lock time/height
    // is 0, which is equivalent to no sequence lock. Since we assume
    // input height of tip+1 for mempool txs and test the resulting
    // min_height and min_time from CalculateSequenceLocks against tip+1.
    int max_input_height{0};
    for (const int height : prev_heights.value()) {
        // Can ignore mempool inputs since we'll fail if they had non-zero locks
        if (height != next_tip.nHeight) {
            max_input_height = std::max(max_input_height, height);
        }
    }

    // tip->GetAncestor(max_input_height) should never return a nullptr
    // because max_input_height is always less than the tip height.
    // It would, however, be a bad bug to continue execution, since a
    // LockPoints object with the maxInputBlock member set to nullptr
    // signifies no relative lock time.
    return LockPoints{min_height, min_time, Assert(tip->GetAncestor(max_input_height))};
}